

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AppendProperty(cmMakefile *this,string *prop,char *value,bool asString)

{
  bool bVar1;
  reference dir;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  const_iterator vi;
  string local_268;
  undefined1 local_248 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string local_228;
  cmValueWithOrigin local_208;
  undefined1 local_1b8 [8];
  cmListFileBacktrace lfbt_2;
  string local_180;
  cmValueWithOrigin local_160;
  undefined1 local_110 [8];
  cmListFileBacktrace lfbt_1;
  allocator local_c9;
  string local_c8;
  cmValueWithOrigin local_a8;
  undefined1 local_58 [8];
  cmListFileBacktrace lfbt;
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmMakefile *this_local;
  
  lfbt.Snapshot.Position.Position._7_1_ = asString;
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    GetBacktrace((cmListFileBacktrace *)local_58,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
    cmValueWithOrigin::cmValueWithOrigin(&local_a8,&local_c8,(cmListFileBacktrace *)local_58);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
              (&this->IncludeDirectoriesEntries,&local_a8);
    cmValueWithOrigin::~cmValueWithOrigin(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_58);
  }
  else {
    bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar1) {
      GetBacktrace((cmListFileBacktrace *)local_110,this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_180,value,
                 (allocator *)((long)&lfbt_2.Snapshot.Position.Position + 7));
      cmValueWithOrigin::cmValueWithOrigin(&local_160,&local_180,(cmListFileBacktrace *)local_110);
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                (&this->CompileOptionsEntries,&local_160);
      cmValueWithOrigin::~cmValueWithOrigin(&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&lfbt_2.Snapshot.Position.Position + 7));
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_110);
    }
    else {
      bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
      if (bVar1) {
        GetBacktrace((cmListFileBacktrace *)local_1b8,this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_228,value,
                   (allocator *)
                   ((long)&varArgsExpanded.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmValueWithOrigin::cmValueWithOrigin(&local_208,&local_228,(cmListFileBacktrace *)local_1b8)
        ;
        std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                  (&this->CompileDefinitionsEntries,&local_208);
        cmValueWithOrigin::~cmValueWithOrigin(&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&varArgsExpanded.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1b8);
      }
      else {
        bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
        if (bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_248);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_268,value,(allocator *)((long)&vi._M_current + 7));
          cmSystemTools::ExpandListArgument
                    (&local_268,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_248,false);
          std::__cxx11::string::~string((string *)&local_268);
          std::allocator<char>::~allocator((allocator<char> *)((long)&vi._M_current + 7));
          local_280._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_248);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_278,&local_280);
          while( true ) {
            local_288._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_248);
            bVar1 = __gnu_cxx::operator!=(&local_278,&local_288);
            if (!bVar1) break;
            dir = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_278);
            AddLinkDirectory(this,dir);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_278);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_248);
        }
        else {
          cmPropertyMap::AppendProperty
                    (&this->Properties,prop,value,(bool)(lfbt.Snapshot.Position.Position._7_1_ & 1))
          ;
        }
      }
    }
  }
  return;
}

Assistant:

void cmMakefile::AppendProperty(const std::string& prop,
                                const char* value,
                                bool asString)
{
  if (prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->IncludeDirectoriesEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileOptionsEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileDefinitionsEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if ( prop == "LINK_DIRECTORIES" )
    {
    std::vector<std::string> varArgsExpanded;
    cmSystemTools::ExpandListArgument(value, varArgsExpanded);
    for(std::vector<std::string>::const_iterator vi = varArgsExpanded.begin();
        vi != varArgsExpanded.end(); ++vi)
      {
      this->AddLinkDirectory(*vi);
      }
    return;
    }

  this->Properties.AppendProperty(prop, value, asString);
}